

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O2

CharList * pkg_prependToList(CharList *l,char *str)

{
  CharList *pCVar1;
  
  pCVar1 = (CharList *)uprv_malloc_63(0x10);
  if (pCVar1 != (CharList *)0x0) {
    pCVar1->str = str;
    pCVar1->next = l;
  }
  return pCVar1;
}

Assistant:

CharList *pkg_prependToList(CharList *l, const char *str)
{
  CharList *newList;
  newList = uprv_malloc(sizeof(CharList));

  /* test for NULL */
  if(newList == NULL) {
    return NULL;
  }

  newList->str = str;
  newList->next = l;
  return newList;
}